

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc-attack-detector.c
# Opt level: O2

_Bool check_crc(uint8_t *S,uint8_t *buf,uint32_t len,uint8_t *IV)

{
  uint in_EAX;
  uint8_t *b;
  long *plVar1;
  uint32_t crc;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if ((IV != (uint8_t *)0x0) && (*(long *)S == *(long *)IV)) {
    crc_update((uint32_t *)((long)&uStack_38 + 4),"\x01");
    crc_update((uint32_t *)((long)&uStack_38 + 4),"");
  }
  plVar1 = (long *)(buf + len);
  for (; buf < plVar1; buf = (uint8_t *)((long)buf + 8)) {
    b = "\x01";
    if (*(long *)S != *(long *)buf) {
      b = "";
    }
    crc_update((uint32_t *)((long)&uStack_38 + 4),b);
    crc_update((uint32_t *)((long)&uStack_38 + 4),"");
  }
  return uStack_38._4_4_ == 0;
}

Assistant:

static bool check_crc(const uint8_t *S, const uint8_t *buf,
                      uint32_t len, const uint8_t *IV)
{
    uint32_t crc;
    const uint8_t *c;

    crc = 0;
    if (IV && !CMP(S, IV)) {
        crc_update(&crc, ONE);
        crc_update(&crc, ZERO);
    }
    for (c = buf; c < buf + len; c += SSH_BLOCKSIZE) {
        if (!CMP(S, c)) {
            crc_update(&crc, ONE);
            crc_update(&crc, ZERO);
        } else {
            crc_update(&crc, ZERO);
            crc_update(&crc, ZERO);
        }
    }
    return (crc == 0);
}